

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_write_test.cpp
# Opt level: O0

void test<8>(void)

{
  allocator<std::array<unsigned_short,_174762UL>_> *this;
  uint uVar1;
  ulong uVar2;
  bool bVar3;
  _Ios_Openmode _Var4;
  reference puVar5;
  ulong __n;
  reference this_00;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  ostream *poVar9;
  double dVar10;
  size_t *bucket_size;
  value_type *bucket;
  size_t bucket_index;
  iterator iStack_aabc8;
  uint x;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  byte abStack_aaba8 [4];
  int i;
  char buf [699048];
  allocator<unsigned_long> local_f1;
  value_type_conflict2 local_f0;
  undefined1 local_e8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> buckets_sizes;
  undefined1 local_c8 [8];
  vector<std::array<unsigned_short,_174762UL>,_std::allocator<std::array<unsigned_short,_174762UL>_>_>
  buckets;
  size_t max_bucket_size;
  __cxx11 local_a0 [32];
  string local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  uint local_40;
  int i_1;
  allocator<std::basic_ofstream<char,_std::char_traits<char>_>_> local_29;
  undefined1 local_28 [8];
  vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  of;
  uint mask;
  uint streams;
  
  of.
  super__Vector_base<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x100;
  of.
  super__Vector_base<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0xff;
  relClockOffset();
  std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>::allocator(&local_29);
  std::
  vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  ::vector((vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
            *)local_28,0,&local_29);
  std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>::~allocator(&local_29);
  for (local_40 = 0; local_40 < 0x100; local_40 = local_40 + 1) {
    std::__cxx11::to_string(local_a0,local_40);
    std::operator+((char *)local_80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"./tmp/");
    std::operator+(local_60,(char *)local_80);
    _Var4 = std::operator|(_S_bin,_S_trunc);
    _Var4 = std::operator|(_Var4,_S_in);
    max_bucket_size._4_4_ = std::operator|(_Var4,_S_out);
    std::vector<std::ofstream,std::allocator<std::ofstream>>::
    emplace_back<std::__cxx11::string,std::_Ios_Openmode>
              ((vector<std::ofstream,std::allocator<std::ofstream>> *)local_28,local_60,
               (_Ios_Openmode *)((long)&max_bucket_size + 4));
    std::__cxx11::string::~string((string *)local_60);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::~string((string *)local_a0);
  }
  buckets.
  super__Vector_base<std::array<unsigned_short,_174762UL>,_std::allocator<std::array<unsigned_short,_174762UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x2aaaa;
  this = (allocator<std::array<unsigned_short,_174762UL>_> *)
         ((long)&buckets_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<std::array<unsigned_short,_174762UL>_>::allocator(this);
  std::
  vector<std::array<unsigned_short,_174762UL>,_std::allocator<std::array<unsigned_short,_174762UL>_>_>
  ::vector((vector<std::array<unsigned_short,_174762UL>,_std::allocator<std::array<unsigned_short,_174762UL>_>_>
            *)local_c8,0x100,this);
  std::allocator<std::array<unsigned_short,_174762UL>_>::~allocator
            ((allocator<std::array<unsigned_short,_174762UL>_> *)
             ((long)&buckets_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_f0 = 0;
  std::allocator<unsigned_long>::allocator(&local_f1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_e8,0x100,&local_f0,
             &local_f1);
  std::allocator<unsigned_long>::~allocator(&local_f1);
  __end1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&orig);
  iStack_aabc8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&orig);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=(&__end1,&stack0xfffffffffff55438);
    if (!bVar3) break;
    puVar5 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end1);
    uVar1 = *puVar5;
    __n = (ulong)(uVar1 & (uint)of.
                                super__Vector_base<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    this_00 = std::
              vector<std::array<unsigned_short,_174762UL>,_std::allocator<std::array<unsigned_short,_174762UL>_>_>
              ::operator[]((vector<std::array<unsigned_short,_174762UL>,_std::allocator<std::array<unsigned_short,_174762UL>_>_>
                            *)local_c8,__n);
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_e8,__n);
    uVar2 = *pvVar6;
    *pvVar6 = uVar2 + 1;
    pvVar7 = std::array<unsigned_short,_174762UL>::operator[](this_00,uVar2 % 0x2aaaa);
    *pvVar7 = (value_type_conflict1)(uVar1 >> 0x10);
    __range1._4_4_ = __range1._4_4_ + 1;
    abStack_aaba8[((ulong)(long)__range1._4_4_ % 0x2aaaa) * 4] =
         (byte)uVar1 &
         (byte)(uint)of.
                     super__Vector_base<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (*pvVar6 % 0x2aaaa == 0) {
      pvVar8 = std::
               vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
               ::operator[]((vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                             *)local_28,__n);
      std::ostream::write((char *)pvVar8,(long)abStack_aaba8);
    }
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&__end1);
  }
  poVar9 = std::operator<<((ostream *)&std::cerr,"bpe");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,8);
  poVar9 = std::operator<<(poVar9,". ");
  dVar10 = relClockOffset();
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,1024.0 / dVar10);
  poVar9 = std::operator<<(poVar9," mb/s");
  std::operator<<(poVar9,"\n");
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_e8);
  std::
  vector<std::array<unsigned_short,_174762UL>,_std::allocator<std::array<unsigned_short,_174762UL>_>_>
  ::~vector((vector<std::array<unsigned_short,_174762UL>,_std::allocator<std::array<unsigned_short,_174762UL>_>_>
             *)local_c8);
  std::
  vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  ::~vector((vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
             *)local_28);
  return;
}

Assistant:

static void test() {
    const unsigned streams = 1<<bpe;
    unsigned mask = streams - 1;

    relClockOffset();

    vector <ofstream> of(0);
    for (int i = 0; i < streams; i++) {
        of.emplace_back("./tmp/" + to_string(i) + ".bin", ios::binary | ios::trunc | ios::in | ios::out);
    }


    constexpr size_t max_bucket_size = 128*1024*1024 / streams * 32 / (32-bpe) / 4;
    vector<array<uint16_t, max_bucket_size> > buckets(streams);
    vector<size_t> buckets_sizes(streams, 0);

    char buf[max_bucket_size*4];

    int i;
    for (unsigned x:orig) {
        size_t bucket_index = x & mask;
        auto &bucket = buckets[bucket_index];
        size_t &bucket_size = buckets_sizes[bucket_index];
        bucket[bucket_size++ % max_bucket_size] = x>>16;
        buf[++i % max_bucket_size*4] = x&mask;
        if (bucket_size % max_bucket_size == 0) {
            of[bucket_index].write(buf, max_bucket_size*4*(32-bpe)/32);
        }
    }

    cerr << "bpe" << bpe << ". "<< els*4/1024/1024 / relClockOffset() << " mb/s"<< "\n";

}